

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * __thiscall rw::Matrix::transform(Matrix *this,Matrix *mat,CombineOp op)

{
  undefined1 local_5c [8];
  Matrix tmp;
  CombineOp op_local;
  Matrix *mat_local;
  Matrix *this_local;
  
  tmp.pos.z = (float32)op;
  unique0x100000b5 = mat;
  if (op == COMBINEREPLACE) {
    memcpy(this,mat,0x40);
  }
  else if (op == COMBINEPRECONCAT) {
    mult((Matrix *)local_5c,mat,this);
    memcpy(this,local_5c,0x40);
  }
  else if (op == COMBINEPOSTCONCAT) {
    mult((Matrix *)local_5c,this,mat);
    memcpy(this,local_5c,0x40);
  }
  return this;
}

Assistant:

Matrix*
Matrix::transform(const Matrix *mat, CombineOp op)
{
	Matrix tmp;
	switch(op){
	case COMBINEREPLACE:
		*this = *mat;
		break;
	case COMBINEPRECONCAT:
		mult(&tmp, mat, this);
		*this = tmp;
		break;
	case COMBINEPOSTCONCAT:
		mult(&tmp, this, mat);
		*this = tmp;
		break;
	}
	return this;
}